

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::
state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::defer_event<afsm::test::events::begin>
          (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,begin *event)

{
  value_type local_40;
  id_type *local_38;
  anon_class_16_2_20c42392 local_30;
  begin *pbStack_18;
  begin evt;
  begin *event_local;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *this_local;
  
  pbStack_18 = event;
  detail::observer_wrapper<afsm::test::test_fsm_observer>::
  defer_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::begin>
            (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,event);
  local_38 = (id_type *)&detail::event<afsm::test::events::begin>::id;
  local_30.this = this;
  std::__cxx11::
  list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::defer_event<afsm::test::events::begin>(afsm::test::events::begin&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->deferred_events_,&local_30,&local_38);
  local_40 = (value_type)&detail::event<afsm::test::events::begin>::id;
  std::
  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::insert(&this->deferred_event_ids_,&local_40);
  return;
}

Assistant:

void
    defer_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;

        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace_back([&, evt]() mutable {
            return process_event_dispatch(::std::move(evt));
        }, &evt_identity::id);
        deferred_event_ids_.insert(&evt_identity::id);
    }